

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

bool Assimp::BaseImporter::CheckMagicToken
               (IOSystem *pIOHandler,string *pFile,void *_magic,uint num,uint offset,uint size)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar5;
  ulong __n;
  bool bVar6;
  allocator<char> local_51;
  anon_union_16_3_a3d9a762 anon_var_0;
  long *plVar4;
  
  if (0x10 < size) {
    __assert_fail("size <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                  ,299,
                  "static bool Assimp::BaseImporter::CheckMagicToken(IOSystem *, const std::string &, const void *, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if (_magic == (void *)0x0) {
    __assert_fail("_magic",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                  ,300,
                  "static bool Assimp::BaseImporter::CheckMagicToken(IOSystem *, const std::string &, const void *, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if (pIOHandler != (IOSystem *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)anon_var_0.data,"rb",&local_51);
    iVar3 = (*pIOHandler->_vptr_IOSystem[4])
                      (pIOHandler,(pFile->_M_dataplus)._M_p,
                       CONCAT44(anon_var_0.data_u32[1],anon_var_0.data_u32[0]));
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    std::__cxx11::string::~string((string *)anon_var_0.data);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x20))(plVar4,offset,0);
      __n = (ulong)size;
      uVar5 = (**(code **)(*plVar4 + 0x10))(plVar4,&anon_var_0,1,__n);
      if (uVar5 == __n) {
        while (bVar6 = num != 0, num = num - 1, bVar6) {
          if (size == 4) {
            uVar2 = *_magic;
            if ((anon_var_0.data_u32[0] == uVar2) ||
               (anon_var_0.data_u32[0] ==
                (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)))
            goto LAB_003a57ae;
          }
          else if (size == 2) {
            uVar1 = (ushort)*_magic;
            if ((uVar1 == (ushort)anon_var_0.data_u32[0]) ||
               ((ushort)(uVar1 << 8 | uVar1 >> 8) == (ushort)anon_var_0.data_u32[0]))
            goto LAB_003a57ae;
          }
          else {
            iVar3 = bcmp(_magic,&anon_var_0,__n);
            if (iVar3 == 0) {
LAB_003a57ae:
              bVar6 = true;
              goto LAB_003a57b0;
            }
          }
          _magic = (void *)((long)_magic + __n);
        }
      }
      bVar6 = false;
LAB_003a57b0:
      (**(code **)(*plVar4 + 8))(plVar4);
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool BaseImporter::CheckMagicToken(IOSystem* pIOHandler, const std::string& pFile,
    const void* _magic, unsigned int num, unsigned int offset, unsigned int size)
{
    ai_assert( size <= 16 );
    ai_assert( _magic );

    if (!pIOHandler) {
        return false;
    }
    union {
        const char* magic;
        const uint16_t* magic_u16;
        const uint32_t* magic_u32;
    };
    magic = reinterpret_cast<const char*>(_magic);
    std::unique_ptr<IOStream> pStream (pIOHandler->Open(pFile));
    if (pStream.get() ) {

        // skip to offset
        pStream->Seek(offset,aiOrigin_SET);

        // read 'size' characters from the file
        union {
            char data[16];
            uint16_t data_u16[8];
            uint32_t data_u32[4];
        };
        if(size != pStream->Read(data,1,size)) {
            return false;
        }

        for (unsigned int i = 0; i < num; ++i) {
            // also check against big endian versions of tokens with size 2,4
            // that's just for convenience, the chance that we cause conflicts
            // is quite low and it can save some lines and prevent nasty bugs
            if (2 == size) {
                uint16_t rev = *magic_u16;
                ByteSwap::Swap(&rev);
                if (data_u16[0] == *magic_u16 || data_u16[0] == rev) {
                    return true;
                }
            }
            else if (4 == size) {
                uint32_t rev = *magic_u32;
                ByteSwap::Swap(&rev);
                if (data_u32[0] == *magic_u32 || data_u32[0] == rev) {
                    return true;
                }
            }
            else {
                // any length ... just compare
                if(!memcmp(magic,data,size)) {
                    return true;
                }
            }
            magic += size;
        }
    }
    return false;
}